

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::get_array_data(db *this,string *content)

{
  bool bVar1;
  char *pcVar2;
  db_bit *local_98;
  db_bit *local_48;
  db_bit *bit;
  string buffer;
  db_bit_type type;
  string *content_local;
  db *this_local;
  
  buffer.field_2._12_4_ = 8;
  pop_next((string *)&bit,this,content);
  local_48 = (db_bit *)0x0;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&bit);
  buffer.field_2._12_4_ = convert_to_bit_type(this,*pcVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bit,
                          "]");
  if ((bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bit,"("), bVar1)) {
    std::__cxx11::string::insert((ulong)content,(string *)0x0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &bit,"(");
    if (bVar1) {
      buffer.field_2._12_4_ = 10;
    }
  }
  if (buffer.field_2._12_4_ != 8) {
    if (buffer.field_2._12_4_ == 10) {
      local_48 = read_container_bit(this,content,true);
    }
    else {
      local_48 = read_value_bit(this,content,true);
    }
    if (local_48 == (db_bit *)0x0) {
      local_98 = (db_bit *)0x0;
    }
    else {
      local_98 = get_array_data(this,content);
    }
    local_48->nex = local_98;
  }
  std::__cxx11::string::~string((string *)&bit);
  return local_48;
}

Assistant:

lan::db_bit * db::get_array_data(std::string & content){
            db_bit_type type = Unsafe;
            std::string buffer = pop_next(content);
            db_bit * bit = nullptr;
            type = convert_to_bit_type(buffer[0]);
            if(buffer != "]" and buffer != "(")
                content.insert(0, buffer);
            else if(buffer == "(")
                type = Container;
            if(type != Unsafe){
                switch(type){
                    case Container: bit = read_container_bit(content, true); break;
                    default: bit = read_value_bit(content, true); break;
                } bit->nex = (bit) ? get_array_data(content) : nullptr;
            } return bit;
        }